

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  
  pcVar4 = FLAGS_gtest_color_abi_cxx11_;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = String::CaseInsensitiveCStringEquals(FLAGS_gtest_color_abi_cxx11_,"auto");
  if (bVar2) {
    pcVar4 = getenv("TERM");
    bVar3 = String::CStringEquals(pcVar4,"xterm");
    bVar2 = true;
    if (!bVar3) {
      bVar3 = String::CStringEquals(pcVar4,"xterm-color");
      if (!bVar3) {
        bVar3 = String::CStringEquals(pcVar4,"xterm-256color");
        if (!bVar3) {
          bVar3 = String::CStringEquals(pcVar4,"screen");
          if (!bVar3) {
            bVar3 = String::CStringEquals(pcVar4,"screen-256color");
            if (!bVar3) {
              bVar3 = String::CStringEquals(pcVar4,"tmux");
              if (!bVar3) {
                bVar3 = String::CStringEquals(pcVar4,"tmux-256color");
                if (!bVar3) {
                  bVar3 = String::CStringEquals(pcVar4,"rxvt-unicode");
                  if (!bVar3) {
                    bVar3 = String::CStringEquals(pcVar4,"rxvt-unicode-256color");
                    if (!bVar3) {
                      bVar3 = String::CStringEquals(pcVar4,"linux");
                      if (!bVar3) {
                        bVar2 = String::CStringEquals(pcVar4,"cygwin");
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar2 = (bool)(bVar2 & stdout_is_tty);
  }
  else {
    bVar3 = String::CaseInsensitiveCStringEquals(pcVar4,"yes");
    bVar2 = true;
    if (!bVar3) {
      bVar3 = String::CaseInsensitiveCStringEquals(pcVar4,"true");
      if (!bVar3) {
        bVar3 = String::CaseInsensitiveCStringEquals(pcVar4,"t");
        if (!bVar3) {
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            bVar2 = String::CStringEquals(pcVar4,"1");
            return bVar2;
          }
          goto LAB_0014b7b2;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
LAB_0014b7b2:
  __stack_chk_fail();
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  const char* const gtest_color = GTEST_FLAG(color).c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if GTEST_OS_WINDOWS && !GTEST_OS_WINDOWS_MINGW
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        String::CStringEquals(term, "xterm") ||
        String::CStringEquals(term, "xterm-color") ||
        String::CStringEquals(term, "xterm-256color") ||
        String::CStringEquals(term, "screen") ||
        String::CStringEquals(term, "screen-256color") ||
        String::CStringEquals(term, "tmux") ||
        String::CStringEquals(term, "tmux-256color") ||
        String::CStringEquals(term, "rxvt-unicode") ||
        String::CStringEquals(term, "rxvt-unicode-256color") ||
        String::CStringEquals(term, "linux") ||
        String::CStringEquals(term, "cygwin");
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
      String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}